

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitOutputTest.cpp
# Opt level: O0

void __thiscall
JUnitTestOutputTestRunner::JUnitTestOutputTestRunner
          (JUnitTestOutputTestRunner *this,TestResult *result)

{
  TestResult *result_local;
  JUnitTestOutputTestRunner *this_local;
  
  TestResult::TestResult(&this->result_,result);
  this->currentGroupName_ = (char *)0x0;
  this->currentTest_ = (UtestShell *)0x0;
  this->firstTestInGroup_ = true;
  this->timeTheTestTakes_ = 0;
  this->numberOfChecksInTest_ = 0;
  this->testFailure_ = (TestFailure *)0x0;
  millisTime = 0;
  theTime = "1978-10-03T00:00:00";
  CppUTestStore(&GetPlatformSpecificTimeInMillis);
  GetPlatformSpecificTimeInMillis = MockGetPlatformSpecificTimeInMillis;
  CppUTestStore(&GetPlatformSpecificTimeString);
  GetPlatformSpecificTimeString = MockGetPlatformSpecificTimeString;
  return;
}

Assistant:

explicit JUnitTestOutputTestRunner(const TestResult& result) :
        result_(result), currentGroupName_(NULLPTR), currentTest_(NULLPTR), firstTestInGroup_(true), timeTheTestTakes_(0), numberOfChecksInTest_(0), testFailure_(NULLPTR)
    {
        millisTime = 0;
        theTime =  "1978-10-03T00:00:00";

        UT_PTR_SET(GetPlatformSpecificTimeInMillis, MockGetPlatformSpecificTimeInMillis);
        UT_PTR_SET(GetPlatformSpecificTimeString, MockGetPlatformSpecificTimeString);
    }